

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::setChild
          (StreamingConcatenationExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00483edc + *(int *)(&DAT_00483edc + index * 4)))();
  return;
}

Assistant:

void StreamingConcatenationExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: operatorToken = child.token(); return;
        case 2: sliceSize = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: innerOpenBrace = child.token(); return;
        case 4: expressions = child.node()->as<SeparatedSyntaxList<StreamExpressionSyntax>>(); return;
        case 5: innerCloseBrace = child.token(); return;
        case 6: closeBrace = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}